

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::clauseIndex(SelectionCompiler *this)

{
  uint uVar1;
  pointer pTVar2;
  char *__s1;
  int iVar3;
  uint *puVar4;
  type_info *ptVar5;
  undefined4 *puVar6;
  bool bVar7;
  any intVal;
  _Arg __arg;
  Token token;
  any local_88;
  Token local_78;
  _Arg local_60;
  _Storage local_58;
  Token local_50;
  Token local_38;
  
  tokenNext(&local_50,this);
  if (local_50.tok == 2) {
    puVar4 = (uint *)std::__any_caster<int>(&local_50.value);
    if (puVar4 == (uint *)0x0) {
      std::__throw_bad_any_cast();
    }
    uVar1 = *puVar4;
    pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->itokenInfix ==
         ((long)(this->atokenInfix).
                super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555) ||
       (pTVar2[this->itokenInfix].tok != 0x402)) {
      local_88._M_manager = std::any::_Manager_internal<int>::_S_manage;
      local_88._M_storage._4_4_ = 0;
      local_88._M_storage._0_4_ = uVar1;
      local_78.tok = 0x10400;
      local_78.intValue = 0;
      local_78.value._M_storage._4_4_ = 0;
      local_78.value._M_storage._0_4_ = uVar1;
      local_78.value._M_manager = std::any::_Manager_internal<int>::_S_manage;
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&local_78);
      if (local_78.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_78.value._M_manager)(_Op_destroy,&local_78.value,(_Arg *)0x0);
        local_78.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      if (local_88._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_88._M_manager)(_Op_destroy,&local_88,(_Arg *)0x0);
        local_88._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      bVar7 = true;
    }
    else {
      tokenNext(&local_38,this);
      if (local_38.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_38.value._M_manager)(_Op_destroy,&local_38.value,(_Arg *)0x0);
        local_38.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->itokenInfix ==
           ((long)(this->atokenInfix).
                  super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555) ||
         (pTVar2[this->itokenInfix].tok != 2)) {
        bVar7 = numberExpected(this);
      }
      else {
        tokenNext(&local_78,this);
        local_88._M_storage._M_ptr = (void *)0x0;
        if (local_78.value._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          local_88._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        else {
          local_60._M_obj = &local_88;
          (*local_78.value._M_manager)(_Op_xfer,&local_78.value,&local_60);
        }
        if (local_78.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_78.value._M_manager)(_Op_destroy,&local_78.value,(_Arg *)0x0);
          local_78.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        ptVar5 = std::any::type(&local_88);
        __s1 = *(char **)(ptVar5 + 8);
        if (__s1 == _put) {
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (*__s1 != '*') {
            iVar3 = strcmp(__s1,_put);
            bVar7 = iVar3 != 0;
          }
        }
        if (bVar7 == false) {
          puVar6 = (undefined4 *)std::__any_caster<int>(&local_88);
          if (puVar6 == (undefined4 *)0x0) {
            std::__throw_bad_any_cast();
          }
          local_78.value._M_storage._4_4_ = *puVar6;
          local_78.value._M_storage._0_4_ = uVar1;
          local_60._M_obj = std::any::_Manager_internal<std::pair<int,_int>_>::_S_manage;
          local_78.tok = 0x10400;
          local_78.intValue = 0;
          local_78.value._M_manager = std::any::_Manager_internal<std::pair<int,_int>_>::_S_manage;
          local_58 = local_78.value._M_storage;
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                    (&this->ltokenPostfix,&local_78);
          if (local_78.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_78.value._M_manager)(_Op_destroy,&local_78.value,(_Arg *)0x0);
            local_78.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if ((code *)local_60._M_obj != (code *)0x0) {
            (*(code *)local_60)(3,&local_60,0);
            local_60._M_obj = (code *)0x0;
          }
        }
        if (local_88._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_88._M_manager)(_Op_destroy,&local_88,(_Arg *)0x0);
          local_88._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        bVar7 = (bool)(bVar7 ^ 1);
      }
    }
  }
  else {
    bVar7 = numberExpected(this);
  }
  if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
  }
  return bVar7;
}

Assistant:

bool SelectionCompiler::clauseIndex() {
    Token token = tokenNext();
    if (token.tok == Token::integer) {
      int index = std::any_cast<int>(token.value);
      int tok   = tokPeek();
      if (tok == Token::to) {
        tokenNext();
        tok = tokPeek();
        if (tok != Token::integer) { return numberExpected(); }

        std::any intVal = tokenNext().value;
        int first       = index;
        if (intVal.type() != typeid(int)) { return false; }
        int second = std::any_cast<int>(intVal);

        return addTokenToPostfix(
            Token(Token::index, std::any(std::make_pair(first, second))));

      } else {
        return addTokenToPostfix(Token(Token::index, std::any(index)));
      }
    } else {
      return numberExpected();
    }
  }